

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O0

void call(_Bool canAssign)

{
  uint8_t argCount;
  
  argumentList();
  emitBytes('\0','\0');
  return;
}

Assistant:

static bool call(ObjClosure* closure, int argCount) {
    //Arity Check
    if (argCount != closure->function->arity) {
        runtimeError("Expected %d arguments but got %d.",
                     closure->function->arity, argCount);
        return false;
    }

    if (vm.frameCount == FRAMES_MAX) {
        runtimeError("Stack overflow.");
        return false;
    }

    CallFrame *frame = &vm.frames[vm.frameCount++];
    frame->closure = closure;
    frame->ip = closure->function->chunk.code;

    //-1 to skip slot zero
    frame->slots = vm.stackTop - argCount - 1;
    return true;
}